

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O0

uint32_t spvtools::opt::anon_unknown_0::NegateConstant(ConstantManager *const_mgr,Constant *c)

{
  int iVar1;
  Type *pTVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Constant *c_local;
  ConstantManager *const_mgr_local;
  
  pTVar2 = analysis::Constant::type(c);
  iVar1 = (*pTVar2->_vptr_Type[0xe])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    pTVar2 = analysis::Constant::type(c);
    iVar1 = (*pTVar2->_vptr_Type[0xc])();
    if (CONCAT44(extraout_var_00,iVar1) == 0) {
      pTVar2 = analysis::Constant::type(c);
      iVar1 = (*pTVar2->_vptr_Type[10])();
      if (CONCAT44(extraout_var_01,iVar1) == 0) {
        __assert_fail("c->type()->AsInteger()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                      ,0x11a,
                      "uint32_t spvtools::opt::(anonymous namespace)::NegateConstant(analysis::ConstantManager *, const analysis::Constant *)"
                     );
      }
      const_mgr_local._4_4_ = NegateIntegerConstant(const_mgr,c);
    }
    else {
      const_mgr_local._4_4_ = NegateFloatingPointConstant(const_mgr,c);
    }
  }
  else {
    const_mgr_local._4_4_ = NegateVectorConstant(const_mgr,c);
  }
  return const_mgr_local._4_4_;
}

Assistant:

uint32_t NegateConstant(analysis::ConstantManager* const_mgr,
                        const analysis::Constant* c) {
  if (c->type()->AsVector()) {
    return NegateVectorConstant(const_mgr, c);
  } else if (c->type()->AsFloat()) {
    return NegateFloatingPointConstant(const_mgr, c);
  } else {
    assert(c->type()->AsInteger());
    return NegateIntegerConstant(const_mgr, c);
  }
}